

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImputerValidator.cpp
# Opt level: O0

Result * CoreML::validate<(MLModelType)601>(Result *__return_storage_ptr__,Model *format)

{
  allocator<CoreML::Specification::FeatureType::TypeCase> *this;
  allocator<CoreML::Specification::Imputer::ReplaceValueCase> *paVar1;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::Imputer::ReplaceValueCase> __l_00;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_01;
  initializer_list<CoreML::Specification::Imputer::ReplaceValueCase> __l_02;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_03;
  initializer_list<CoreML::Specification::Imputer::ReplaceValueCase> __l_04;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_05;
  initializer_list<CoreML::Specification::Imputer::ReplaceValueCase> __l_06;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_07;
  initializer_list<CoreML::Specification::Imputer::ReplaceValueCase> __l_08;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_09;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_10;
  ModelDescription *interface;
  bool bVar2;
  int32 modelVersion;
  TypeCase TVar3;
  TypeCase TVar4;
  int iVar5;
  ImputedValueCase IVar6;
  CoreML *pCVar7;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar8;
  FeatureType *pFVar9;
  ArrayFeatureType *pAVar10;
  int64 iVar11;
  int64 iVar12;
  DoubleVector *this_00;
  Int64Vector *this_01;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  allocator local_589;
  undefined1 local_588 [40];
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  allocator<CoreML::Specification::FeatureType::TypeCase> local_536;
  less<CoreML::Specification::FeatureType::TypeCase> local_535;
  TypeCase local_534;
  iterator local_530;
  size_type local_528;
  set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_520;
  allocator local_4e9;
  string local_4e8;
  uchar *local_4c0;
  size_type local_4b8;
  set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
  local_4b0;
  allocator<CoreML::Specification::FeatureType::TypeCase> local_47e;
  less<CoreML::Specification::FeatureType::TypeCase> local_47d;
  TypeCase local_47c;
  iterator local_478;
  size_type local_470;
  set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_468;
  allocator<CoreML::Specification::Imputer::ReplaceValueCase> local_436;
  less<CoreML::Specification::Imputer::ReplaceValueCase> local_435;
  ReplaceValueCase local_434;
  iterator local_430;
  size_type local_428;
  set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
  local_420;
  allocator<CoreML::Specification::FeatureType::TypeCase> local_3ee;
  less<CoreML::Specification::FeatureType::TypeCase> local_3ed;
  TypeCase local_3ec;
  iterator local_3e8;
  size_type local_3e0;
  set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_3d8;
  allocator local_3a1;
  string local_3a0;
  uchar *local_378;
  size_type local_370;
  set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
  local_368;
  allocator<CoreML::Specification::FeatureType::TypeCase> local_336;
  less<CoreML::Specification::FeatureType::TypeCase> local_335;
  TypeCase local_334;
  iterator local_330;
  size_type local_328;
  set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_320;
  allocator<CoreML::Specification::Imputer::ReplaceValueCase> local_2ee;
  less<CoreML::Specification::Imputer::ReplaceValueCase> local_2ed;
  ReplaceValueCase local_2ec;
  iterator local_2e8;
  size_type local_2e0;
  set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
  local_2d8;
  allocator<CoreML::Specification::FeatureType::TypeCase> local_2a6;
  less<CoreML::Specification::FeatureType::TypeCase> local_2a5;
  TypeCase local_2a4;
  iterator local_2a0;
  size_type local_298;
  set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_290;
  allocator<CoreML::Specification::Imputer::ReplaceValueCase> local_25e;
  less<CoreML::Specification::Imputer::ReplaceValueCase> local_25d;
  ReplaceValueCase local_25c;
  iterator local_258;
  size_type local_250;
  set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
  local_248;
  allocator<CoreML::Specification::FeatureType::TypeCase> local_212;
  less<CoreML::Specification::FeatureType::TypeCase> local_211;
  TypeCase local_210 [2];
  iterator local_208;
  size_type local_200;
  set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_1f8;
  Imputer *local_1c8;
  Imputer *imputer;
  anon_class_24_3_489072cd checkInterfaceCompatible;
  string local_1a0;
  string local_178;
  string local_150;
  FeatureDescription *output;
  FeatureDescription *input;
  Result local_f8;
  TypeCase local_c8 [8];
  iterator local_a8;
  size_type local_a0;
  undefined1 local_98 [8];
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  possible_types;
  undefined1 local_70 [80];
  ModelDescription *local_20;
  ModelDescription *description;
  Model *format_local;
  
  description = (ModelDescription *)format;
  format_local = (Model *)__return_storage_ptr__;
  local_20 = Specification::Model::description(format);
  Result::Result((Result *)(local_70 + 0x28));
  interface = local_20;
  modelVersion = Specification::Model::specificationversion((Model *)description);
  validateModelDescription((Result *)local_70,interface,modelVersion);
  Result::operator=((Result *)(local_70 + 0x28),(Result *)local_70);
  Result::~Result((Result *)local_70);
  bVar2 = Result::good((Result *)(local_70 + 0x28));
  if (!bVar2) {
    Result::Result(__return_storage_ptr__,(Result *)(local_70 + 0x28));
    possible_types.
    super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    goto LAB_003668c3;
  }
  local_c8[0] = kInt64Type;
  local_c8[1] = kDoubleType;
  local_c8[2] = kMultiArrayType;
  local_c8[3] = kStringType;
  local_c8[4] = 6;
  local_a8 = local_c8;
  local_a0 = 5;
  this = (allocator<CoreML::Specification::FeatureType::TypeCase> *)
         (local_f8.m_message._M_storage._M_storage + 7);
  std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(this);
  __l_10._M_len = local_a0;
  __l_10._M_array = local_a8;
  std::
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
            *)local_98,__l_10,this);
  std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator
            ((allocator<CoreML::Specification::FeatureType::TypeCase> *)
             (local_f8.m_message._M_storage._M_storage + 7));
  pCVar7 = (CoreML *)Specification::ModelDescription::input(local_20);
  validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
            (&local_f8,pCVar7,(RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,
             (int)local_98,in_R8);
  Result::operator=((Result *)(local_70 + 0x28),&local_f8);
  Result::~Result(&local_f8);
  bVar2 = Result::good((Result *)(local_70 + 0x28));
  if (bVar2) {
    pCVar7 = (CoreML *)Specification::ModelDescription::output(local_20);
    validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)&input,pCVar7,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)local_98,
               in_R8);
    Result::operator=((Result *)(local_70 + 0x28),(Result *)&input);
    Result::~Result((Result *)&input);
    bVar2 = Result::good((Result *)(local_70 + 0x28));
    if (bVar2) {
      pRVar8 = Specification::ModelDescription::input(local_20);
      output = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::
               operator[](pRVar8,0);
      pRVar8 = Specification::ModelDescription::output(local_20);
      local_150._M_storage._M_storage =
           (uchar  [8])
           google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::operator[]
                     (pRVar8,0);
      pFVar9 = Specification::FeatureDescription::type
                         ((FeatureDescription *)local_150._M_storage._M_storage);
      TVar3 = Specification::FeatureType::Type_case(pFVar9);
      pFVar9 = Specification::FeatureDescription::type(output);
      TVar4 = Specification::FeatureType::Type_case(pFVar9);
      if (TVar3 == TVar4) {
        pFVar9 = Specification::FeatureDescription::type(output);
        TVar3 = Specification::FeatureType::Type_case(pFVar9);
        if (TVar3 == kMultiArrayType) {
          pFVar9 = Specification::FeatureDescription::type(output);
          pAVar10 = Specification::FeatureType::multiarraytype(pFVar9);
          iVar5 = Specification::ArrayFeatureType::shape_size(pAVar10);
          if (iVar5 == 1) {
            pFVar9 = Specification::FeatureDescription::type
                               ((FeatureDescription *)local_150._M_storage._M_storage);
            pAVar10 = Specification::FeatureType::multiarraytype(pFVar9);
            iVar5 = Specification::ArrayFeatureType::shape_size(pAVar10);
            if (iVar5 == 1) {
              pFVar9 = Specification::FeatureDescription::type(output);
              pAVar10 = Specification::FeatureType::multiarraytype(pFVar9);
              iVar11 = Specification::ArrayFeatureType::shape(pAVar10,0);
              pFVar9 = Specification::FeatureDescription::type
                                 ((FeatureDescription *)local_150._M_storage._M_storage);
              pAVar10 = Specification::FeatureType::multiarraytype(pFVar9);
              iVar12 = Specification::ArrayFeatureType::shape(pAVar10,0);
              if (iVar11 == iVar12) goto LAB_00365b72;
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_1a0,
                       "Shape of output array does not match shape of input array.",
                       (allocator *)((long)&checkInterfaceCompatible.format + 7));
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1a0);
            std::__cxx11::string::~string((string *)&local_1a0);
            std::allocator<char>::~allocator
                      ((allocator<char> *)((long)&checkInterfaceCompatible.format + 7));
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_178,
                       "Only 1 dimensional arrays input features are supported by the imputer.",
                       (allocator *)(local_1a0._M_storage._M_storage + 7));
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_178);
            std::__cxx11::string::~string((string *)&local_178);
            std::allocator<char>::~allocator
                      ((allocator<char> *)(local_1a0._M_storage._M_storage + 7));
          }
        }
        else {
LAB_00365b72:
          imputer = (Imputer *)output;
          checkInterfaceCompatible.input = (FeatureDescription *)(local_70 + 0x28);
          checkInterfaceCompatible.result = (Result *)description;
          local_1c8 = Specification::Model::imputer((Model *)description);
          IVar6 = Specification::Imputer::ImputedValue_case(local_1c8);
          switch(IVar6) {
          case IMPUTEDVALUE_NOT_SET:
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)local_588,"Imputer parameter must be set.",&local_589);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_588);
            std::__cxx11::string::~string((string *)local_588);
            std::allocator<char>::~allocator((allocator<char> *)&local_589);
            break;
          case kImputedDoubleValue:
            local_210[0] = kDoubleType;
            local_210[1] = 5;
            local_208 = local_210;
            local_200 = 2;
            std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(&local_212);
            __l_09._M_len = local_200;
            __l_09._M_array = local_208;
            std::
            set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
            ::set(&local_1f8,__l_09,&local_211,&local_212);
            local_25c = kReplaceDoubleValue;
            local_258 = &local_25c;
            local_250 = 1;
            std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>::allocator(&local_25e);
            __l_08._M_len = local_250;
            __l_08._M_array = local_258;
            std::
            set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
            ::set(&local_248,__l_08,&local_25d,&local_25e);
            bVar2 = validate<(MLModelType)601>::anon_class_24_3_489072cd::operator()
                              ((anon_class_24_3_489072cd *)&imputer,&local_1f8,&local_248);
            std::
            set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
            ::~set(&local_248);
            std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>::~allocator(&local_25e)
            ;
            std::
            set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
            ::~set(&local_1f8);
            std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator(&local_212);
            if (((bVar2 ^ 0xffU) & 1) == 0) goto switchD_00365bf7_default;
            Result::Result(__return_storage_ptr__,(Result *)(local_70 + 0x28));
            break;
          case kImputedInt64Value:
            local_2a4 = kInt64Type;
            local_2a0 = &local_2a4;
            local_298 = 1;
            std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(&local_2a6);
            __l_07._M_len = local_298;
            __l_07._M_array = local_2a0;
            std::
            set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
            ::set(&local_290,__l_07,&local_2a5,&local_2a6);
            local_2ec = kReplaceInt64Value;
            local_2e8 = &local_2ec;
            local_2e0 = 1;
            std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>::allocator(&local_2ee);
            __l_06._M_len = local_2e0;
            __l_06._M_array = local_2e8;
            std::
            set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
            ::set(&local_2d8,__l_06,&local_2ed,&local_2ee);
            bVar2 = validate<(MLModelType)601>::anon_class_24_3_489072cd::operator()
                              ((anon_class_24_3_489072cd *)&imputer,&local_290,&local_2d8);
            std::
            set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
            ::~set(&local_2d8);
            std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>::~allocator(&local_2ee)
            ;
            std::
            set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
            ::~set(&local_290);
            std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator(&local_2a6);
            if (((bVar2 ^ 0xffU) & 1) == 0) goto switchD_00365bf7_default;
            Result::Result(__return_storage_ptr__,(Result *)(local_70 + 0x28));
            break;
          case kImputedStringValue:
            local_3ec = kStringType;
            local_3e8 = &local_3ec;
            local_3e0 = 1;
            std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(&local_3ee);
            __l_03._M_len = local_3e0;
            __l_03._M_array = local_3e8;
            std::
            set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
            ::set(&local_3d8,__l_03,&local_3ed,&local_3ee);
            local_434 = kReplaceStringValue;
            local_430 = &local_434;
            local_428 = 1;
            std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>::allocator(&local_436);
            __l_02._M_len = local_428;
            __l_02._M_array = local_430;
            std::
            set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
            ::set(&local_420,__l_02,&local_435,&local_436);
            bVar2 = validate<(MLModelType)601>::anon_class_24_3_489072cd::operator()
                              ((anon_class_24_3_489072cd *)&imputer,&local_3d8,&local_420);
            std::
            set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
            ::~set(&local_420);
            std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>::~allocator(&local_436)
            ;
            std::
            set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
            ::~set(&local_3d8);
            std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator(&local_3ee);
            if (((bVar2 ^ 0xffU) & 1) == 0) goto switchD_00365bf7_default;
            Result::Result(__return_storage_ptr__,(Result *)(local_70 + 0x28));
            break;
          case kImputedDoubleArray:
            local_334 = kMultiArrayType;
            local_330 = &local_334;
            local_328 = 1;
            std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(&local_336);
            __l_05._M_len = local_328;
            __l_05._M_array = local_330;
            std::
            set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
            ::set(&local_320,__l_05,&local_335,&local_336);
            local_3a0._M_storage._M_storage[4] = '\v';
            local_3a0._M_storage._M_storage[5] = '\0';
            local_3a0._M_storage._M_storage[6] = '\0';
            local_3a0._M_storage._M_storage[7] = '\0';
            local_378 = local_3a0._M_storage._M_storage + 4;
            local_370 = 1;
            paVar1 = (allocator<CoreML::Specification::Imputer::ReplaceValueCase> *)
                     (local_3a0._M_storage._M_storage + 2);
            std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>::allocator(paVar1);
            __l_04._M_len = local_370;
            __l_04._M_array = (iterator)local_378;
            std::
            set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
            ::set(&local_368,__l_04,
                  (less<CoreML::Specification::Imputer::ReplaceValueCase> *)
                  (local_3a0._M_storage._M_storage + 3),paVar1);
            bVar2 = validate<(MLModelType)601>::anon_class_24_3_489072cd::operator()
                              ((anon_class_24_3_489072cd *)&imputer,&local_320,&local_368);
            std::
            set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
            ::~set(&local_368);
            std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>::~allocator
                      ((allocator<CoreML::Specification::Imputer::ReplaceValueCase> *)
                       (local_3a0._M_storage._M_storage + 2));
            std::
            set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
            ::~set(&local_320);
            std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator(&local_336);
            if (((bVar2 ^ 0xffU) & 1) == 0) {
              pFVar9 = Specification::FeatureDescription::type(output);
              pAVar10 = Specification::FeatureType::multiarraytype(pFVar9);
              iVar11 = Specification::ArrayFeatureType::shape(pAVar10,0);
              this_00 = Specification::Imputer::imputeddoublearray(local_1c8);
              iVar5 = Specification::DoubleVector::vector_size(this_00);
              if (iVar11 == iVar5) goto switchD_00365bf7_default;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_3a0,
                         "Shape of imputed array value does not match shape of input array.",
                         &local_3a1);
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_3a0);
              std::__cxx11::string::~string((string *)&local_3a0);
              std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
            }
            else {
              Result::Result(__return_storage_ptr__,(Result *)(local_70 + 0x28));
            }
            break;
          case kImputedInt64Array:
            local_47c = kMultiArrayType;
            local_478 = &local_47c;
            local_470 = 1;
            std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(&local_47e);
            __l_01._M_len = local_470;
            __l_01._M_array = local_478;
            std::
            set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
            ::set(&local_468,__l_01,&local_47d,&local_47e);
            local_4e8._M_storage._M_storage[4] = '\f';
            local_4e8._M_storage._M_storage[5] = '\0';
            local_4e8._M_storage._M_storage[6] = '\0';
            local_4e8._M_storage._M_storage[7] = '\0';
            local_4c0 = local_4e8._M_storage._M_storage + 4;
            local_4b8 = 1;
            paVar1 = (allocator<CoreML::Specification::Imputer::ReplaceValueCase> *)
                     (local_4e8._M_storage._M_storage + 2);
            std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>::allocator(paVar1);
            __l_00._M_len = local_4b8;
            __l_00._M_array = (iterator)local_4c0;
            std::
            set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
            ::set(&local_4b0,__l_00,
                  (less<CoreML::Specification::Imputer::ReplaceValueCase> *)
                  (local_4e8._M_storage._M_storage + 3),paVar1);
            bVar2 = validate<(MLModelType)601>::anon_class_24_3_489072cd::operator()
                              ((anon_class_24_3_489072cd *)&imputer,&local_468,&local_4b0);
            std::
            set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
            ::~set(&local_4b0);
            std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>::~allocator
                      ((allocator<CoreML::Specification::Imputer::ReplaceValueCase> *)
                       (local_4e8._M_storage._M_storage + 2));
            std::
            set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
            ::~set(&local_468);
            std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator(&local_47e);
            if (((bVar2 ^ 0xffU) & 1) == 0) {
              pFVar9 = Specification::FeatureDescription::type(output);
              pAVar10 = Specification::FeatureType::multiarraytype(pFVar9);
              iVar11 = Specification::ArrayFeatureType::shape(pAVar10,0);
              this_01 = Specification::Imputer::imputedint64array(local_1c8);
              iVar5 = Specification::Int64Vector::vector_size(this_01);
              if (iVar11 == iVar5) goto switchD_00365bf7_default;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_4e8,
                         "Shape of imputed array value does not match shape of input array.",
                         &local_4e9);
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_4e8);
              std::__cxx11::string::~string((string *)&local_4e8);
              std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
            }
            else {
              Result::Result(__return_storage_ptr__,(Result *)(local_70 + 0x28));
            }
            break;
          case kImputedStringDictionary:
          case kImputedInt64Dictionary:
            local_534 = kDictionaryType;
            local_530 = &local_534;
            local_528 = 1;
            std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(&local_536);
            __l._M_len = local_528;
            __l._M_array = local_530;
            std::
            set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
            ::set(&local_520,__l,&local_535,&local_536);
            local_548 = 0;
            uStack_540 = 0;
            local_558 = 0;
            uStack_550 = 0;
            local_588[0x20] = '\0';
            local_588[0x21] = '\0';
            local_588[0x22] = '\0';
            local_588[0x23] = '\0';
            local_588[0x24] = '\0';
            local_588[0x25] = '\0';
            local_588[0x26] = '\0';
            local_588[0x27] = '\0';
            uStack_560 = 0;
            std::
            set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
            ::set((set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
                   *)(local_588 + 0x20));
            bVar2 = validate<(MLModelType)601>::anon_class_24_3_489072cd::operator()
                              ((anon_class_24_3_489072cd *)&imputer,&local_520,
                               (set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
                                *)(local_588 + 0x20));
            std::
            set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
            ::~set((set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
                    *)(local_588 + 0x20));
            std::
            set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
            ::~set(&local_520);
            std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator(&local_536);
            if (((bVar2 ^ 0xffU) & 1) == 0) goto switchD_00365bf7_default;
            Result::Result(__return_storage_ptr__,(Result *)(local_70 + 0x28));
            break;
          default:
switchD_00365bf7_default:
            Result::Result(__return_storage_ptr__,(Result *)(local_70 + 0x28));
          }
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_150,
                   "Type of input feature does not match the output type feature.",
                   (allocator *)(local_178._M_storage._M_storage + 7));
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_150);
        std::__cxx11::string::~string((string *)&local_150);
        std::allocator<char>::~allocator((allocator<char> *)(local_178._M_storage._M_storage + 7));
      }
    }
    else {
      Result::Result(__return_storage_ptr__,(Result *)(local_70 + 0x28));
    }
  }
  else {
    Result::Result(__return_storage_ptr__,(Result *)(local_70 + 0x28));
  }
  possible_types.
  super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  std::
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::~vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
             *)local_98);
LAB_003668c3:
  Result::~Result((Result *)(local_70 + 0x28));
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_imputer>(const Specification::Model& format) {
        const auto& description = format.description();

        Result result;

        // Validate its a MLModel type.
        result = validateModelDescription(description, format.specificationversion());
        if (!result.good()) {
            return result;
        }
        
        // Convenience typedefs
        typedef Specification::FeatureType FT;
        typedef Specification::Imputer::ReplaceValueCase RVC;
        
        
        std::vector<Specification::FeatureType::TypeCase> possible_types = {
            FT::kInt64Type, FT::kDoubleType, FT::kMultiArrayType,
            FT::kStringType, FT::kDictionaryType};
        
        // Validate the inputs, though we'll have to do more of this manually.
        result = validateDescriptionsContainFeatureWithTypes(description.input(), 1, possible_types);
        
        if (!result.good()) {
            return result;
        }
        
        // Validate the outputs
        result = validateDescriptionsContainFeatureWithTypes(description.output(), 1, possible_types);
        
        if (!result.good()) {
            return result;
        }
        
            // From the above, we know that we have exactly one input and one output type.
        const auto& input = description.input()[0];
        const auto& output = description.output()[0];
        
        // make sure the input and the output match.
        if(output.type().Type_case() != input.type().Type_case()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "Type of input feature does not match the output type feature.");
        }
        
        // If it's an array, we need to test sizes.
        if(input.type().Type_case() == FT::kMultiArrayType) {
            if(input.type().multiarraytype().shape_size() != 1) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                "Only 1 dimensional arrays input features are supported by the imputer.");
            }
            
            if(output.type().multiarraytype().shape_size() != 1
               || (input.type().multiarraytype().shape(0) != output.type().multiarraytype().shape(0))) {
                return  Result(ResultType::INVALID_MODEL_PARAMETERS,
                                "Shape of output array does not match shape of input array.");
            }
        }
        
           
        // Input and output types are allowed based on the values present in the
        auto checkInterfaceCompatible =
        [&](const std::set<Specification::FeatureType::TypeCase>& compatibleFeatureTypes,
            const std::set<Specification::Imputer::ReplaceValueCase>& compatibleReplaceTypes) {
            
            if(!compatibleFeatureTypes.count(input.type().Type_case())) {
                result = Result(ResultType::INVALID_MODEL_PARAMETERS,
                       "Type of input feature \"" + input.name() + "\" is not compatible with given imputed value type.");
                return false;
            }
            
            
            // Check to make sure the the replace value is fine
            if(format.imputer().ReplaceValue_case() != Specification::Imputer::REPLACEVALUE_NOT_SET) {
                if(!compatibleReplaceTypes.count(format.imputer().ReplaceValue_case())) {
                    result = Result(ResultType::INVALID_MODEL_PARAMETERS,
                                    "Type of given replace value not compatible with input feature type.");
                    return false;
                }
            }
            
            // We're all okay now.
            return true;
        };
               
        // Validate the different combinations of stuff.
        const auto& imputer = format.imputer();
        switch (imputer.ImputedValue_case()) {
            case Specification::Imputer::kImputedDoubleValue:
                if(!checkInterfaceCompatible({FT::kDoubleType, FT::kMultiArrayType}, {RVC::kReplaceDoubleValue})) {
                        return result;
                    }
                break;
                
            case Specification::Imputer::kImputedInt64Value:
                if(!checkInterfaceCompatible({FT::kInt64Type}, {RVC::kReplaceInt64Value})) {
                        return result;
                    }
                break;
            case Specification::Imputer::kImputedDoubleArray:
                if(!checkInterfaceCompatible({FT::kMultiArrayType}, {RVC::kReplaceDoubleValue})) {
                    return result;
                }
                
                    // Check to make sure the array sizes match
                if(input.type().multiarraytype().shape(0) != static_cast<int64_t>(imputer.imputeddoublearray().vector_size())) {
                    return  Result(ResultType::INVALID_MODEL_PARAMETERS,
                                   "Shape of imputed array value does not match shape of input array.");
                }
                
                break;
            case Specification::Imputer::kImputedStringValue:
                if(!checkInterfaceCompatible({FT::kStringType}, {RVC::kReplaceStringValue})) {
                    return result;
                }
                break;
                    
            case Specification::Imputer::kImputedInt64Array:
                if(!checkInterfaceCompatible({FT::kMultiArrayType}, {RVC::kReplaceInt64Value})) {
                    return result;
                }
                
                    // Check to make sure the array sizes match
                if(input.type().multiarraytype().shape(0) != static_cast<int64_t>(imputer.imputedint64array().vector_size())) {
                    return  Result(ResultType::INVALID_MODEL_PARAMETERS,
                                   "Shape of imputed array value does not match shape of input array.");
                }
                break;
                    
            case Specification::Imputer::kImputedStringDictionary:
            case Specification::Imputer::kImputedInt64Dictionary:
                    // This only works with a full on ungiven replacement value.
                if(!checkInterfaceCompatible({FT::kDictionaryType}, {})) {
                    return result;
                }
                break;
                    
            case Specification::Imputer::IMPUTEDVALUE_NOT_SET:
                return Result(ResultType::INVALID_MODEL_PARAMETERS, "Imputer parameter must be set.");
                break;
        }

        return result;
    }